

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetHeaderRowHeight(void)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char *text;
  ImGuiStyle *pIVar6;
  uint column_n;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  int iVar9;
  undefined1 local_28 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  auVar7._0_4_ = GetTextLineHeight();
  auVar7._4_60_ = extraout_var;
  local_28 = auVar7._0_16_;
  column_n = 0;
  uVar4 = 0;
  if (GImGui->CurrentTable != (ImGuiTable *)0x0) {
    uVar4 = GImGui->CurrentTable->ColumnsCount;
  }
  for (; (~((int)uVar4 >> 0x1f) & uVar4) != column_n; column_n = column_n + 1) {
    uVar5 = TableGetColumnFlags(column_n);
    if ((uVar5 & 0x1001000) == 0x1000000) {
      text = TableGetColumnName(column_n);
      auVar8._0_8_ = CalcTextSize(text,(char *)0x0,false,-1.0);
      auVar8._8_56_ = extraout_var_00;
      auVar1 = vmovshdup_avx(auVar8._0_16_);
      uVar2 = vcmpss_avx512f(auVar1,local_28,2);
      bVar3 = (bool)((byte)uVar2 & 1);
      iVar9 = local_28._0_4_;
      local_28._4_12_ = auVar1._4_12_;
      local_28._0_4_ = (uint)bVar3 * iVar9 + (uint)!bVar3 * auVar1._0_4_;
    }
  }
  pIVar6 = GetStyle();
  auVar1 = vfmadd231ss_fma(local_28,ZEXT416((uint)(pIVar6->CellPadding).y),ZEXT416(0x40000000));
  return auVar1._0_4_;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        ImGuiTableColumnFlags flags = TableGetColumnFlags(column_n);
        if ((flags & ImGuiTableColumnFlags_IsEnabled) && !(flags & ImGuiTableColumnFlags_NoHeaderLabel))
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    }
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}